

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O1

Gia_Man_t * Gia_ManDupOntop(Gia_Man_t *p,Gia_Man_t *p2)

{
  int iVar1;
  char *pcVar2;
  ulong uVar3;
  Gia_Obj_t *pGVar4;
  int *piVar5;
  uint uVar6;
  int iVar7;
  Gia_Man_t *p_00;
  size_t sVar8;
  char *pcVar9;
  Gia_Obj_t *pGVar10;
  Vec_Int_t *pVVar11;
  Gia_Man_t *pGVar12;
  Gia_Obj_t *pGVar13;
  long lVar14;
  uint uVar15;
  long lVar16;
  long lVar17;
  
  if (p->vCos->nSize - p->nRegs != p2->vCis->nSize - p2->nRegs) {
    __assert_fail("Gia_ManPoNum(p) == Gia_ManPiNum(p2)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaDup.c"
                  ,0x79a,"Gia_Man_t *Gia_ManDupOntop(Gia_Man_t *, Gia_Man_t *)");
  }
  if (p->nRegs != 0) {
    __assert_fail("Gia_ManRegNum(p) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaDup.c"
                  ,0x79b,"Gia_Man_t *Gia_ManDupOntop(Gia_Man_t *, Gia_Man_t *)");
  }
  if (p2->nRegs != 0) {
    __assert_fail("Gia_ManRegNum(p2) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaDup.c"
                  ,0x79c,"Gia_Man_t *Gia_ManDupOntop(Gia_Man_t *, Gia_Man_t *)");
  }
  p_00 = Gia_ManStart(p2->nObjs + p->nObjs);
  pcVar2 = p->pName;
  if (pcVar2 == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    sVar8 = strlen(pcVar2);
    pcVar9 = (char *)malloc(sVar8 + 1);
    strcpy(pcVar9,pcVar2);
  }
  p_00->pName = pcVar9;
  pcVar2 = p->pSpec;
  if (pcVar2 == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    sVar8 = strlen(pcVar2);
    pcVar9 = (char *)malloc(sVar8 + 1);
    strcpy(pcVar9,pcVar2);
  }
  p_00->pSpec = pcVar9;
  Gia_ManHashAlloc(p_00);
  p->pObjs->Value = 0;
  pVVar11 = p->vCis;
  if (0 < pVVar11->nSize) {
    lVar17 = 0;
    do {
      iVar7 = pVVar11->pArray[lVar17];
      if (((long)iVar7 < 0) || (p->nObjs <= iVar7)) goto LAB_006a95cd;
      pGVar13 = p->pObjs;
      if (pGVar13 == (Gia_Obj_t *)0x0) break;
      pGVar10 = Gia_ManAppendObj(p_00);
      uVar3 = *(ulong *)pGVar10;
      *(ulong *)pGVar10 = uVar3 | 0x9fffffff;
      *(ulong *)pGVar10 =
           uVar3 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20
      ;
      pGVar4 = p_00->pObjs;
      if ((pGVar10 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar10)) {
LAB_006a95ec:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar10 - (long)pGVar4) >> 2) * -0x55555555);
      pGVar4 = p_00->pObjs;
      if ((pGVar10 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar10)) goto LAB_006a95ec;
      pGVar13[iVar7].Value = (int)((ulong)((long)pGVar10 - (long)pGVar4) >> 2) * 0x55555556;
      lVar17 = lVar17 + 1;
      pVVar11 = p->vCis;
    } while (lVar17 < pVVar11->nSize);
  }
  iVar7 = p->nObjs;
  if ((0 < iVar7) && (pGVar13 = p->pObjs, pGVar13 != (Gia_Obj_t *)0x0)) {
    lVar17 = 0;
    do {
      uVar3 = *(ulong *)pGVar13;
      if ((uVar3 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar3) {
        if (((int)pGVar13[-(uVar3 & 0x1fffffff)].Value < 0) ||
           (uVar6 = (uint)(uVar3 >> 0x20), (int)pGVar13[-(ulong)(uVar6 & 0x1fffffff)].Value < 0))
        goto LAB_006a960b;
        uVar6 = Gia_ManHashAnd(p_00,pGVar13[-(uVar3 & 0x1fffffff)].Value ^ (uint)(uVar3 >> 0x1d) & 1
                               ,pGVar13[-(ulong)(uVar6 & 0x1fffffff)].Value ^ uVar6 >> 0x1d & 1);
        pGVar13->Value = uVar6;
      }
      lVar17 = lVar17 + 1;
      iVar7 = p->nObjs;
    } while ((lVar17 < iVar7) && (pGVar13 = p->pObjs + lVar17, p->pObjs != (Gia_Obj_t *)0x0));
  }
  pGVar13 = p2->pObjs;
  pGVar13->Value = 0;
  lVar17 = (long)p->vCos->nSize;
  if (0 < lVar17) {
    piVar5 = p->vCos->pArray;
    lVar14 = 0;
    do {
      iVar1 = piVar5[lVar14];
      if (((long)iVar1 < 0) || (iVar7 <= iVar1)) goto LAB_006a95cd;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar4 = p->pObjs + iVar1;
      uVar15 = (uint)*(undefined8 *)pGVar4;
      uVar6 = pGVar4[-(ulong)(uVar15 & 0x1fffffff)].Value;
      if ((int)uVar6 < 0) goto LAB_006a960b;
      lVar16 = (long)p2->vCis->nSize;
      if (lVar16 - p2->nRegs <= lVar14) {
        __assert_fail("v < Gia_ManPiNum(p)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1b2,"Gia_Obj_t *Gia_ManPi(Gia_Man_t *, int)");
      }
      if (lVar16 <= lVar14) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar1 = p2->vCis->pArray[lVar14];
      if (((long)iVar1 < 0) || (p2->nObjs <= iVar1)) goto LAB_006a95cd;
      pGVar13[iVar1].Value = uVar15 >> 0x1d & 1 ^ uVar6;
      lVar14 = lVar14 + 1;
    } while (lVar17 != lVar14);
  }
  if (0 < p2->nObjs) {
    lVar14 = 8;
    lVar17 = 0;
    do {
      pGVar13 = p2->pObjs;
      if (pGVar13 == (Gia_Obj_t *)0x0) break;
      uVar3 = *(ulong *)((long)pGVar13 + lVar14 + -8);
      if ((uVar3 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar3) {
        uVar6 = *(uint *)((long)pGVar13 +
                         lVar14 + (ulong)(uint)((int)(uVar3 & 0x1fffffff) << 2) * -3);
        if (((int)uVar6 < 0) ||
           (uVar15 = *(uint *)((long)pGVar13 +
                              lVar14 + (ulong)((uint)(uVar3 >> 0x1e) & 0x7ffffffc) * -3),
           (int)uVar15 < 0)) goto LAB_006a960b;
        iVar7 = Gia_ManHashAnd(p_00,uVar6 ^ (uint)(uVar3 >> 0x1d) & 1,
                               uVar15 ^ (uint)(uVar3 >> 0x3d) & 1);
        *(int *)(&pGVar13->field_0x0 + lVar14) = iVar7;
      }
      lVar17 = lVar17 + 1;
      lVar14 = lVar14 + 0xc;
    } while (lVar17 < p2->nObjs);
  }
  pVVar11 = p2->vCos;
  if (0 < pVVar11->nSize) {
    lVar17 = 0;
    do {
      iVar7 = pVVar11->pArray[lVar17];
      if (((long)iVar7 < 0) || (p2->nObjs <= iVar7)) {
LAB_006a95cd:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p2->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar13 = p2->pObjs + iVar7;
      if ((int)pGVar13[-(ulong)((uint)*(undefined8 *)pGVar13 & 0x1fffffff)].Value < 0) {
LAB_006a960b:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                      ,0xf5,"int Abc_LitNotCond(int, int)");
      }
      uVar6 = Gia_ManAppendCo(p_00,(uint)*(undefined8 *)pGVar13 >> 0x1d & 1 ^
                                   pGVar13[-(ulong)((uint)*(undefined8 *)pGVar13 & 0x1fffffff)].
                                   Value);
      pGVar13->Value = uVar6;
      lVar17 = lVar17 + 1;
      pVVar11 = p2->vCos;
    } while (lVar17 < pVVar11->nSize);
  }
  Gia_ManHashStop(p_00);
  pGVar12 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar12;
}

Assistant:

Gia_Man_t * Gia_ManDupOntop( Gia_Man_t * p, Gia_Man_t * p2 )
{
    Gia_Man_t * pTemp, * pNew;
    Gia_Obj_t * pObj;
    int i;
    assert( Gia_ManPoNum(p) == Gia_ManPiNum(p2) );
    assert( Gia_ManRegNum(p) == 0 );
    assert( Gia_ManRegNum(p2) == 0 );
    pNew = Gia_ManStart( Gia_ManObjNum(p)+Gia_ManObjNum(p2) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManHashAlloc( pNew );
    // dup first AIG
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    // dup second AIG
    Gia_ManConst0(p2)->Value = 0;
    Gia_ManForEachCo( p, pObj, i )
        Gia_ManPi(p2, i)->Value = Gia_ObjFanin0Copy(pObj);
    Gia_ManForEachAnd( p2, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachCo( p2, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManHashStop( pNew );
//    Gia_ManPrintStats( pGiaNew, 0 );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}